

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O2

void HydroUtils::EB_ComputeDivergence
               (Box *bx,Array4<double> *div,Array4<const_double> *fx,Array4<const_double> *fy,
               Array4<const_double> *fz,Array4<const_double> *vfrac,int ncomp,Geometry *geom,
               Real mult,bool fluxes_are_area_weighted,Array4<const_double> *eb_velocity,
               Array4<const_double> *values_on_eb_inflow,Array4<const_amrex::EBCellFlag> *flag_arr,
               Array4<const_double> *barea,Array4<const_double> *bnorm)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  double *pdVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  EBCellFlag *pEVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  double *pdVar41;
  double *pdVar42;
  double *pdVar43;
  double *pdVar44;
  double *pdVar45;
  double *pdVar46;
  ulong uVar47;
  double *pdVar48;
  double *pdVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  long lVar54;
  long lVar55;
  double *pdVar56;
  double *pdVar57;
  double *pdVar58;
  double *pdVar59;
  double *pdVar60;
  int j;
  long lVar61;
  double *pdVar62;
  long lVar63;
  long lVar64;
  double *pdVar65;
  double *pdVar66;
  double *pdVar67;
  double *pdVar68;
  double *pdVar69;
  double *pdVar70;
  ulong uVar71;
  long lVar72;
  EBCellFlag *pEVar73;
  EBCellFlag *pEVar74;
  long local_1b0;
  
  EB_ComputeDivergence(bx,div,fx,fy,fz,vfrac,ncomp,geom,mult,fluxes_are_area_weighted);
  pdVar15 = eb_velocity->p;
  if (pdVar15 != (double *)0x0) {
    dVar1 = (geom->super_CoordSys).inv_dx[0];
    lVar16 = div->jstride;
    lVar17 = div->kstride;
    lVar61 = (long)(bx->smallend).vect[1];
    lVar64 = (long)(bx->smallend).vect[2];
    uVar47 = 0;
    uVar71 = (ulong)(uint)ncomp;
    if (ncomp < 1) {
      uVar71 = uVar47;
    }
    iVar2 = (barea->begin).z;
    iVar3 = (bx->smallend).vect[0];
    lVar72 = (long)iVar3;
    iVar4 = (barea->begin).y;
    lVar18 = barea->kstride;
    lVar19 = barea->jstride;
    iVar5 = (barea->begin).x;
    pdVar20 = barea->p;
    lVar21 = values_on_eb_inflow->kstride;
    lVar22 = values_on_eb_inflow->jstride;
    iVar6 = (vfrac->begin).z;
    iVar7 = (vfrac->begin).y;
    lVar23 = vfrac->kstride;
    lVar24 = vfrac->jstride;
    iVar8 = (vfrac->begin).x;
    pdVar25 = vfrac->p;
    lVar26 = bnorm->kstride;
    lVar50 = (lVar64 - (bnorm->begin).z) * lVar26;
    lVar27 = bnorm->jstride;
    lVar55 = (lVar61 - (bnorm->begin).y) * lVar27;
    lVar28 = bnorm->nstride;
    lVar38 = (long)(bnorm->begin).x;
    pdVar29 = bnorm->p;
    lVar30 = eb_velocity->kstride;
    lVar40 = (lVar64 - (eb_velocity->begin).z) * lVar30;
    lVar31 = eb_velocity->jstride;
    lVar51 = (lVar61 - (eb_velocity->begin).y) * lVar31;
    lVar32 = eb_velocity->nstride;
    lVar52 = (long)(eb_velocity->begin).x;
    iVar9 = (flag_arr->begin).z;
    iVar10 = (flag_arr->begin).y;
    lVar33 = flag_arr->kstride;
    lVar34 = flag_arr->jstride;
    iVar11 = (flag_arr->begin).x;
    pEVar35 = flag_arr->p;
    pdVar67 = div->p + ((lVar72 + (lVar64 - (div->begin).z) * lVar17 +
                                  (lVar61 - (div->begin).y) * lVar16) - (long)(div->begin).x);
    pdVar58 = values_on_eb_inflow->p +
              ((lVar72 + (lVar64 - (values_on_eb_inflow->begin).z) * lVar21 +
                         (lVar61 - (values_on_eb_inflow->begin).y) * lVar22) -
              (long)(values_on_eb_inflow->begin).x);
    lVar36 = div->nstride;
    lVar37 = values_on_eb_inflow->nstride;
    iVar12 = (bx->bigend).vect[0];
    iVar13 = (bx->bigend).vect[1];
    iVar14 = (bx->bigend).vect[2];
    for (; pdVar41 = pdVar29 + ((lVar72 + lVar50 + lVar55) - lVar38),
        pdVar43 = pdVar29 + ((lVar28 + lVar72 + lVar50 + lVar55) - lVar38),
        pdVar45 = pdVar25 + ((lVar72 + (lVar64 - iVar6) * lVar23 + (lVar61 - iVar7) * lVar24) -
                            (long)iVar8), pdVar48 = pdVar15 + ((lVar72 + lVar40 + lVar51) - lVar52),
        pdVar53 = pdVar58, pdVar56 = pdVar15 + ((lVar72 + lVar40 + lVar51 + lVar32 * 2) - lVar52),
        pdVar60 = pdVar20 + ((lVar72 + (lVar64 - iVar2) * lVar18 + (lVar61 - iVar4) * lVar19) -
                            (long)iVar5), pdVar62 = pdVar67,
        pdVar65 = pdVar29 + ((lVar72 + lVar50 + lVar55 + lVar28 * 2) - lVar38),
        pdVar69 = pdVar15 + ((lVar32 + lVar72 + lVar40 + lVar51) - lVar52),
        pEVar73 = pEVar35 + ((lVar72 + (lVar64 - iVar9) * lVar33 + (lVar61 - iVar10) * lVar34) -
                            (long)iVar11), local_1b0 = lVar64, uVar47 != uVar71; uVar47 = uVar47 + 1
        ) {
      for (; pdVar39 = pdVar41, pdVar42 = pdVar60, pdVar44 = pdVar62, pdVar46 = pdVar45,
          pdVar49 = pdVar48, pdVar57 = pdVar56, pdVar59 = pdVar43, lVar63 = lVar61,
          pdVar66 = pdVar65, pdVar68 = pdVar53, pdVar70 = pdVar69, pEVar74 = pEVar73,
          local_1b0 <= iVar14; local_1b0 = local_1b0 + 1) {
        for (; lVar63 <= iVar13; lVar63 = lVar63 + 1) {
          if (iVar3 <= iVar12) {
            lVar54 = 0;
            do {
              if ((pEVar74[lVar54].flag & 3) == 1) {
                pdVar44[lVar54] =
                     (mult / pdVar46[lVar54]) * pdVar68[lVar54] *
                     (pdVar57[lVar54] * pdVar66[lVar54] +
                     pdVar49[lVar54] * pdVar39[lVar54] + pdVar70[lVar54] * pdVar59[lVar54]) *
                     pdVar42[lVar54] * dVar1 + pdVar44[lVar54];
              }
              lVar54 = lVar54 + 1;
            } while ((iVar12 - iVar3) + 1 != (int)lVar54);
          }
          pdVar44 = pdVar44 + lVar16;
          pdVar42 = pdVar42 + lVar19;
          pdVar68 = pdVar68 + lVar22;
          pdVar46 = pdVar46 + lVar24;
          pdVar66 = pdVar66 + lVar27;
          pdVar59 = pdVar59 + lVar27;
          pdVar39 = pdVar39 + lVar27;
          pdVar57 = pdVar57 + lVar31;
          pdVar70 = pdVar70 + lVar31;
          pdVar49 = pdVar49 + lVar31;
          pEVar74 = pEVar74 + lVar34;
        }
        pdVar41 = pdVar41 + lVar26;
        pdVar43 = pdVar43 + lVar26;
        pdVar45 = pdVar45 + lVar23;
        pdVar48 = pdVar48 + lVar30;
        pdVar53 = pdVar53 + lVar21;
        pdVar56 = pdVar56 + lVar30;
        pdVar60 = pdVar60 + lVar18;
        pdVar62 = pdVar62 + lVar17;
        pdVar65 = pdVar65 + lVar26;
        pdVar69 = pdVar69 + lVar30;
        pEVar73 = pEVar73 + lVar33;
      }
      pdVar67 = pdVar67 + lVar36;
      pdVar58 = pdVar58 + lVar37;
    }
  }
  return;
}

Assistant:

void
HydroUtils::EB_ComputeDivergence ( Box const& bx,
                                   Array4<Real> const& div,
                                   AMREX_D_DECL( Array4<Real const> const& fx,
                                                 Array4<Real const> const& fy,
                                                 Array4<Real const> const& fz),
                                   Array4<Real const> const& vfrac,
                                   const int ncomp, Geometry const& geom,
                                   const Real mult,
                                   const bool fluxes_are_area_weighted,
                                   Array4<Real const> const& eb_velocity,
                                   Array4<Real const> const& values_on_eb_inflow,
                                   Array4<EBCellFlag const> const& flag_arr,
                                   Array4<Real const> const& barea,
                                   Array4<Real const> const& bnorm)
{

    // Compute the standard EB divergence term
    EB_ComputeDivergence(bx, div, AMREX_D_DECL(fx, fy, fz),
                         vfrac, ncomp, geom, mult, fluxes_are_area_weighted);

    if( eb_velocity ) {

        AMREX_ASSERT( values_on_eb_inflow );

        const auto &dxinv = geom.InvCellSizeArray();

        amrex::ParallelFor(bx, ncomp, [div,eb_velocity,values_on_eb_inflow,
          flag_arr,barea,vfrac,bnorm,dxinv,mult]
          AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
         if (flag_arr(i,j,k).isSingleValued()) {

           Real Ueb_dot_n = (AMREX_D_TERM(
                                eb_velocity(i,j,k,0)*bnorm(i,j,k,0),
                              + eb_velocity(i,j,k,1)*bnorm(i,j,k,1),
                              + eb_velocity(i,j,k,2)*bnorm(i,j,k,2)));

           div(i,j,k,n) += (mult / vfrac(i,j,k)) *
              values_on_eb_inflow(i,j,k,n) * Ueb_dot_n * barea(i,j,k) * dxinv[0];

         }
        });
     }
}